

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void ClownLZSS::Internal::
     ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,8191u,31u,_1>>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input,
               DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8191U,_31U,__1>
               *output,_func_void_DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_ptr_DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8191U,_31U,__1>_ptr
                       *decompression_function,size_t module_alignment)

{
  ulong uVar1;
  ulong uVar2;
  ulong local_50;
  unsigned_long i;
  unsigned_long total_modules;
  pos_type input_start_position;
  unsigned_long header;
  size_t module_alignment_local;
  _func_void_DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_ptr_DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8191U,_31U,__1>_ptr
  *decompression_function_local;
  DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8191U,_31U,__1>
  *output_local;
  DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input_local;
  
  input_start_position._M_state =
       (__mbstate_t)
       InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
       ::Read<2U,_(ClownLZSS::Internal::Endian)0>
                 ((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                   *)input);
  _total_modules =
       DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
       ::Tell(&input->
               super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
             );
  uVar1 = (long)input_start_position._M_state + 0xfff;
  for (local_50 = 0; local_50 < (uVar1 >> 0xc) - 1; local_50 = local_50 + 1) {
    (*decompression_function)(input,output);
    uVar2 = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            ::Distance(&input->
                        super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                       ,(pos_type *)&total_modules);
    DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
    ::operator+=(&input->
                  super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                 ,(uint)((module_alignment - uVar2 % module_alignment) % module_alignment));
    OutputCommonBase<ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8191U,_31U,_-1>_>
    ::Reset((OutputCommonBase<ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8191U,_31U,__1>_>
             *)output);
  }
  (*decompression_function)(input,output);
  return;
}

Assistant:

void ModuledDecompressionWrapper(DecompressorInput<T1> &input, T2 &output, void (* const decompression_function)(DecompressorInput<T1> &input, T2 &output), const std::size_t module_alignment)
		{
			const auto header = input.template Read<total_bytes, endian>();

			const auto input_start_position = input.Tell();

			const unsigned long total_modules = (header + (0x1000 - 1)) / 0x1000; // Round up.

			for (unsigned long i = 0; i < total_modules - 1; ++i)
			{
				decompression_function(input, output);
				input += (module_alignment - (input.Distance(input_start_position) % module_alignment)) % module_alignment;
				output.Reset();
			}

			decompression_function(input, output);
		}